

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ExtensionSet::RemoveLast(ExtensionSet *this,int number)

{
  byte bVar1;
  int iVar2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar3;
  undefined8 *puVar4;
  Extension *pEVar5;
  LogMessage *pLVar6;
  RepeatedField<int> *pRVar7;
  LogFinisher local_101;
  LogMessage local_100;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  pEVar5 = FindOrNull(this,number);
  if (pEVar5 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x354);
    pLVar6 = LogMessage::operator<<(&local_90,"CHECK failed: extension != nullptr: ");
    pLVar6 = LogMessage::operator<<(pLVar6,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=((LogFinisher *)&local_100,pLVar6);
    LogMessage::~LogMessage(&local_90);
  }
  if (pEVar5->is_repeated == false) {
    LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x355);
    pLVar6 = LogMessage::operator<<(&local_c8,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=((LogFinisher *)&local_100,pLVar6);
    LogMessage::~LogMessage(&local_c8);
  }
  bVar1 = pEVar5->type;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x3f);
    pLVar6 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=((LogFinisher *)&local_100,pLVar6);
    LogMessage::~LogMessage(&local_58);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
  case 1:
    pRVar7 = (pEVar5->field_0).repeated_int32_t_value;
    if (pRVar7->current_size_ < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x2d2);
      pLVar6 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar6);
LAB_003d8091:
      LogMessage::~LogMessage(&local_100);
    }
    break;
  case 2:
    pRVar7 = (pEVar5->field_0).repeated_int32_t_value;
    if (pRVar7->current_size_ < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x2d2);
      pLVar6 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar6);
      goto LAB_003d8091;
    }
    break;
  case 3:
    pRVar7 = (pEVar5->field_0).repeated_int32_t_value;
    if (pRVar7->current_size_ < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x2d2);
      pLVar6 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar6);
      goto LAB_003d8091;
    }
    break;
  case 4:
    pRVar7 = (pEVar5->field_0).repeated_int32_t_value;
    if (pRVar7->current_size_ < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x2d2);
      pLVar6 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar6);
      goto LAB_003d8091;
    }
    break;
  case 5:
    pRVar7 = (pEVar5->field_0).repeated_int32_t_value;
    if (pRVar7->current_size_ < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x2d2);
      pLVar6 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar6);
      goto LAB_003d8091;
    }
    break;
  case 6:
    pRVar7 = (pEVar5->field_0).repeated_int32_t_value;
    if (pRVar7->current_size_ < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x2d2);
      pLVar6 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar6);
      goto LAB_003d8091;
    }
    break;
  case 7:
    pRVar7 = (pEVar5->field_0).repeated_int32_t_value;
    if (pRVar7->current_size_ < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x2d2);
      pLVar6 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar6);
      goto LAB_003d8091;
    }
    break;
  case 8:
    pRVar7 = (pEVar5->field_0).repeated_int32_t_value;
    if (pRVar7->current_size_ < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x2d2);
      pLVar6 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar6);
      goto LAB_003d8091;
    }
    break;
  case 9:
    pRVar3 = (pEVar5->field_0).repeated_string_value;
    if ((pRVar3->super_RepeatedPtrFieldBase).current_size_ < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x397);
      pLVar6 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar6);
      LogMessage::~LogMessage(&local_100);
    }
    iVar2 = (pRVar3->super_RepeatedPtrFieldBase).current_size_;
    (pRVar3->super_RepeatedPtrFieldBase).current_size_ = iVar2 + -1;
    puVar4 = (undefined8 *)((pRVar3->super_RepeatedPtrFieldBase).rep_)->elements[(long)iVar2 + -1];
    puVar4[1] = 0;
    *(undefined1 *)*puVar4 = 0;
    return;
  case 10:
    pRVar3 = (pEVar5->field_0).repeated_string_value;
    if ((pRVar3->super_RepeatedPtrFieldBase).current_size_ < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x397);
      pLVar6 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar6);
      LogMessage::~LogMessage(&local_100);
    }
    iVar2 = (pRVar3->super_RepeatedPtrFieldBase).current_size_;
    (pRVar3->super_RepeatedPtrFieldBase).current_size_ = iVar2 + -1;
    (**(code **)(*((pRVar3->super_RepeatedPtrFieldBase).rep_)->elements[(long)iVar2 + -1] + 0x20))()
    ;
  default:
    goto switchD_003d7dc3_default;
  }
  pRVar7->current_size_ = pRVar7->current_size_ + -1;
switchD_003d7dc3_default:
  return;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) {
  const auto* const_this = this;
  return const_cast<ExtensionSet::Extension*>(const_this->FindOrNull(key));
}